

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.h
# Opt level: O2

bool spvtools::utils::ParseNumber<unsigned_long>(char *text,unsigned_long *value_pointer)

{
  uint *puVar1;
  bool bVar2;
  allocator<char> local_1c9;
  string local_1c8 [32];
  istringstream text_stream;
  uint auStack_190 [90];
  
  if (text == (char *)0x0) {
    return false;
  }
  std::__cxx11::string::string<std::allocator<char>>(local_1c8,text,&local_1c9);
  std::__cxx11::istringstream::istringstream((istringstream *)&text_stream,local_1c8,_S_in);
  std::__cxx11::string::_M_dispose();
  puVar1 = (uint *)((long)auStack_190 + *(long *)(_text_stream + -0x18));
  *puVar1 = *puVar1 & 0xffffffb5;
  std::istream::_M_extract<unsigned_long>((ulong *)&text_stream);
  if ((*text != '\0') &&
     ((*(uint *)((long)auStack_190 + *(long *)(_text_stream + -0x18) + 8) & 7) == 2)) {
    bVar2 = true;
    if ((*text != '-') || (*value_pointer == 0)) goto LAB_001d857c;
    *value_pointer = 0;
  }
  bVar2 = false;
LAB_001d857c:
  std::__cxx11::istringstream::~istringstream((istringstream *)&text_stream);
  return bVar2;
}

Assistant:

bool ParseNumber(const char* text, T* value_pointer) {
  // C++11 doesn't define std::istringstream(int8_t&), so calling this method
  // with a single-byte type leads to implementation-defined behaviour.
  // Similarly for uint8_t.
  static_assert(sizeof(T) > 1,
                "Single-byte types are not supported in this parse method");

  if (!text) return false;
  std::istringstream text_stream(text);
  // Allow both decimal and hex input for integers.
  // It also allows octal input, but we don't care about that case.
  text_stream >> std::setbase(0);
  text_stream >> *value_pointer;

  // We should have read something.
  bool ok = (text[0] != 0) && !text_stream.bad();
  // It should have been all the text.
  ok = ok && text_stream.eof();
  // It should have been in range.
  ok = ok && !text_stream.fail();

  // Work around a bug in the GNU C++11 library. It will happily parse
  // "-1" for uint16_t as 65535.
  if (ok && text[0] == '-')
    ok = !ClampToZeroIfUnsignedType<T>::Clamp(value_pointer);

  return ok;
}